

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O2

void Js::ByteCodeDumper::
     DumpElementRootCP<Js::OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
               (OpCode op,OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  code *pcVar1;
  int iVar2;
  bool bVar3;
  PropertyId propertyId;
  ScriptContext *this;
  PropertyRecord *pPVar4;
  undefined4 *puVar5;
  undefined6 in_register_0000003a;
  
  this = FunctionProxy::GetScriptContext((FunctionProxy *)dumpFunction);
  propertyId = FunctionBody::GetPropertyIdFromCacheId(dumpFunction,data->inlineCacheIndex);
  pPVar4 = ScriptContext::GetPropertyName(this,propertyId);
  iVar2 = (int)CONCAT62(in_register_0000003a,op);
  switch(iVar2) {
  case 0x6a:
  case 0x6e:
switchD_00750560_caseD_6a:
    Output::Print(L" R%d = root.%s #%d",(ulong)data->Value,pPVar4 + 1,(ulong)data->inlineCacheIndex)
    ;
    return;
  case 0x6c:
  case 0x6d:
  case 0x70:
  case 0x71:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x7a:
  case 0x7b:
  case 0x7c:
  case 0x7d:
switchD_00750560_caseD_6c:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                ,0x487,"(false)","Unknown OpCode for OpLayoutElementRootCP");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    return;
  case 0x72:
  case 0x78:
  case 0x7e:
switchD_00750560_caseD_72:
    Output::Print(L" root.%s = R%d #%d",pPVar4 + 1,(ulong)data->Value,(ulong)data->inlineCacheIndex)
    ;
    return;
  case 0x73:
  case 0x79:
  case 0x7f:
    Output::Print(L" root.%s = R%d #%d",pPVar4 + 1,(ulong)data->Value,(ulong)data->inlineCacheIndex)
    ;
    break;
  default:
    if ((iVar2 == 0x54) || (iVar2 == 0x56)) goto switchD_00750560_caseD_72;
    if (iVar2 != 0x124) {
      if (iVar2 != 0x123) goto switchD_00750560_caseD_6c;
      goto switchD_00750560_caseD_6a;
    }
  case 0x6b:
  case 0x6f:
    Output::Print(L" R%d = root.%s #%d",(ulong)data->Value,pPVar4 + 1,(ulong)data->inlineCacheIndex)
    ;
  }
  DumpProfileId(data->inlineCacheIndex);
  return;
}

Assistant:

void ByteCodeDumper::DumpElementRootCP(OpCode op, const unaligned T * data, Js::FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        ScriptContext* scriptContext = dumpFunction->GetScriptContext();
        PropertyId propertyId = dumpFunction->GetPropertyIdFromCacheId(data->inlineCacheIndex);
        PropertyRecord const * pPropertyName = scriptContext->GetPropertyName(propertyId);
        switch (op)
        {
            case OpCode::LdRootFld:
            case OpCode::LdRootMethodFld:
            case OpCode::LdRootFldForTypeOf:
            {
                Output::Print(_u(" R%d = root.%s #%d"), data->Value,
                        pPropertyName->GetBuffer(), data->inlineCacheIndex);
                break;
            }
            case OpCode::InitRootFld:
            case OpCode::InitRootLetFld:
            case OpCode::InitRootConstFld:
            case OpCode::StRootFld:
            case OpCode::StRootFldStrict:
            {
                Output::Print(_u(" root.%s = R%d #%d"), pPropertyName->GetBuffer(),
                        data->Value, data->inlineCacheIndex);
                break;
            }
            case OpCode::ProfiledLdRootFld:
            case OpCode::ProfiledLdRootFldForTypeOf:
            case OpCode::ProfiledLdRootMethodFld:
            {
                Output::Print(_u(" R%d = root.%s #%d"), data->Value,
                        pPropertyName->GetBuffer(), data->inlineCacheIndex);
                DumpProfileId(data->inlineCacheIndex);
                break;
            }
            case OpCode::ProfiledInitRootFld:
            case OpCode::ProfiledStRootFld:
            case OpCode::ProfiledStRootFldStrict:
            {
                Output::Print(_u(" root.%s = R%d #%d"), pPropertyName->GetBuffer(),
                        data->Value, data->inlineCacheIndex);
                DumpProfileId(data->inlineCacheIndex);
                break;
            }
            default:
            {
                AssertMsg(false, "Unknown OpCode for OpLayoutElementRootCP");
                break;
            }
        }
    }